

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O1

void rpn_SizeOfSection(Expression *expr,char *sectionName)

{
  bool bVar1;
  int iVar2;
  Section *sect;
  char *pcVar3;
  size_t sVar4;
  uint8_t *puVar5;
  int *piVar6;
  uint32_t size;
  
  expr->reason = (char *)0x0;
  expr->isKnown = true;
  expr->isSymbol = false;
  expr->rpn = (uint8_t *)0x0;
  expr->rpnCapacity = 0;
  expr->rpnLength = 0;
  expr->rpnPatchSize = 0;
  sect = sect_FindSectionByName(sectionName);
  if (sect != (Section *)0x0) {
    bVar1 = sect_IsSizeKnown(sect);
    if (bVar1) {
      expr->val = sect->size;
      return;
    }
  }
  expr->isKnown = false;
  pcVar3 = (char *)malloc(0x80);
  expr->reason = pcVar3;
  if (pcVar3 != (char *)0x0) {
    iVar2 = snprintf(pcVar3,0x80,"Section \"%s\"\'s size is not known",sectionName);
    if (0x7f < iVar2) {
      pcVar3 = (char *)realloc(expr->reason,(ulong)(iVar2 + 1));
      expr->reason = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_00111add;
      sprintf(pcVar3,"Section \"%s\"\'s size is not known",sectionName);
    }
    sVar4 = strlen(sectionName);
    size = (int)sVar4 + 2;
    puVar5 = reserveSpace(expr,size);
    expr->rpnPatchSize = expr->rpnPatchSize + size;
    *puVar5 = 'S';
    memcpy(puVar5 + 1,sectionName,sVar4 + 1);
    return;
  }
LAB_00111add:
  piVar6 = __errno_location();
  pcVar3 = strerror(*piVar6);
  fatalerror("Can\'t allocate err string: %s\n",pcVar3);
}

Assistant:

void rpn_SizeOfSection(struct Expression *expr, char const *sectionName)
{
	rpn_Init(expr);

	struct Section *section = sect_FindSectionByName(sectionName);

	if (section && sect_IsSizeKnown(section)) {
		expr->val = section->size;
	} else {
		makeUnknown(expr, "Section \"%s\"'s size is not known", sectionName);

		size_t nameLen = strlen(sectionName) + 1; // Room for NUL!
		uint8_t *ptr = reserveSpace(expr, nameLen + 1);

		expr->rpnPatchSize += nameLen + 1;
		*ptr++ = RPN_SIZEOF_SECT;
		memcpy(ptr, sectionName, nameLen);
	}
}